

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence_lanscapes_on_grid_test.cpp
# Opt level: O1

void __thiscall check_construction_of_landscape::test_method(check_construction_of_landscape *this)

{
  Persistence_landscape_on_grid l;
  Persistence_landscape_on_grid g;
  shared_count sStack_f8;
  Persistence_landscape_on_grid local_f0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  char *local_88;
  char *local_80;
  Persistence_landscape_on_grid local_78;
  undefined **local_38;
  undefined1 local_30;
  undefined8 *local_28;
  char **local_20;
  
  Gudhi::Persistence_representations::Persistence_landscape_on_grid::Persistence_landscape_on_grid
            (&local_f0,"data/file_with_diagram_1",100,0xffff);
  Gudhi::Persistence_representations::Persistence_landscape_on_grid::print_to_file
            (&local_f0,"landscape_from_file_with_diagram_1");
  local_78.values_of_landscapes.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.values_of_landscapes.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.values_of_landscapes.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.number_of_functions_for_vectorization = 0;
  local_78.grid_min = 0.0;
  local_78.grid_max = 0.0;
  local_78.number_of_functions_for_projections_to_reals =
       local_78.number_of_functions_for_vectorization;
  Gudhi::Persistence_representations::Persistence_landscape_on_grid::load_landscape_from_file
            (&local_78,"landscape_from_file_with_diagram_1");
  local_88 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_representations/test/persistence_lanscapes_on_grid_test.cpp"
  ;
  local_80 = "";
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_88,0x20);
  Gudhi::Persistence_representations::Persistence_landscape_on_grid::operator==(&local_f0,&local_78)
  ;
  sStack_f8.pi_ = (sp_counted_base *)0x0;
  local_20 = &local_a8;
  local_a8 = "l == g";
  local_a0 = "";
  local_30 = 0;
  local_38 = &PTR__lazy_ostream_00114d00;
  local_28 = &boost::unit_test::lazy_ostream::inst;
  local_b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_representations/test/persistence_lanscapes_on_grid_test.cpp"
  ;
  local_b0 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_f8);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_78.values_of_landscapes);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_f0.values_of_landscapes);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(check_construction_of_landscape) {
  Persistence_landscape_on_grid l("data/file_with_diagram_1", 100, std::numeric_limits<unsigned short>::max());
  l.print_to_file("landscape_from_file_with_diagram_1");

  Persistence_landscape_on_grid g;
  g.load_landscape_from_file("landscape_from_file_with_diagram_1");

  BOOST_CHECK(l == g);
}